

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIEditBox::updateAbsolutePosition(CGUIEditBox *this)

{
  bool bVar1;
  CGUIEditBox *in_RDI;
  IGUIElement *unaff_retaddr;
  rect<int> oldAbsoluteRect;
  CGUIEditBox *in_stack_00000090;
  CGUIEditBox *in_stack_000000b0;
  rect<int> *other;
  rect<int> *this_00;
  
  other = *(rect<int> **)&in_RDI->field_0x40;
  this_00 = *(rect<int> **)&in_RDI->field_0x48;
  IGUIElement::updateAbsolutePosition(unaff_retaddr);
  bVar1 = core::rect<int>::operator!=(this_00,other);
  if (bVar1) {
    calculateFrameRect(in_RDI);
    breakText(in_stack_00000090);
    calculateScrollPos(in_stack_000000b0);
  }
  return;
}

Assistant:

void CGUIEditBox::updateAbsolutePosition()
{
	core::rect<s32> oldAbsoluteRect(AbsoluteRect);
	IGUIElement::updateAbsolutePosition();
	if (oldAbsoluteRect != AbsoluteRect) {
		calculateFrameRect();
		breakText();
		calculateScrollPos();
	}
}